

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_chi2_test<trng::powerlaw_dist<long_double>>(powerlaw_dist<long_double> *d)

{
  unkbyte10 Var1;
  undefined1 x [16];
  pointer __s;
  ulong uVar2;
  pointer plVar3;
  long lVar4;
  int i;
  int iVar5;
  powerlaw_dist<long_double> *this;
  int i_1;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar6;
  longdouble in_ST6;
  undefined8 extraout_XMM0_Qb;
  parameter_type P;
  vector<int,_std::allocator<int>_> count;
  vector<long_double,_std::allocator<long_double>_> quantil;
  vector<double,_std::allocator<double>_> p;
  lcg64_shift R;
  AssertionHandler catchAssertionHandler;
  undefined6 in_stack_fffffffffffffe92;
  vector<int,_std::allocator<int>_> local_148;
  vector<long_double,_std::allocator<long_double>_> local_128;
  vector<double,_std::allocator<double>_> local_108;
  double local_e8;
  undefined2 uStack_e0;
  undefined6 uStack_de;
  ulong local_d8;
  lcg64_shift local_d0;
  longdouble local_b4;
  AssertionHandler local_a8;
  StringRef local_58;
  StringRef local_48;
  SourceLineInfo local_38;
  
  local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_start = (longdouble *)0x0;
  local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (longdouble *)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  __s = (pointer)operator_new(0x200);
  this = (powerlaw_dist<long_double> *)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       __s;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = __s;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 0x80;
  memset(__s,0,0x200);
  iVar5 = 1;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = __s + 0x80;
  do {
    x._10_6_ = in_stack_fffffffffffffe92;
    x._0_10_ = (longdouble)iVar5 * (longdouble)0.0078125;
    trng::powerlaw_dist<long_double>::icdf((result_type_conflict3 *)d,this,(result_type_conflict3)x)
    ;
    if (local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      this = (powerlaw_dist<long_double> *)
             local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_finish;
      lVar6 = in_ST6;
      std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                (&local_128,
                 (iterator)
                 local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(longdouble *)&local_a8);
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = lVar6;
    }
    else {
      *local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
       super__Vector_impl_data._M_finish = in_ST0;
      this = (powerlaw_dist<long_double> *)
             (local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_finish + 1);
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)this;
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x80);
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift(&local_d0,P);
  iVar5 = 0;
  local_b4 = -(longdouble)1;
  do {
    local_d0.S.r = local_d0.S.r * local_d0.P.a + local_d0.P.b;
    Var1 = *(unkbyte10 *)&(d->P).theta_;
    local_e8 = (double)Var1;
    uStack_e0 = (undefined2)((unkuint10)Var1 >> 0x40);
    uVar2 = local_d0.S.r >> 0x11 ^ local_d0.S.r;
    uVar2 = uVar2 << 0x1f ^ uVar2;
    local_d8 = uVar2 >> 1 ^ uVar2 >> 9;
    lVar6 = in_ST4;
    powl();
    uVar2 = 0;
    plVar3 = local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if ((longdouble)CONCAT28(uStack_e0,local_e8) * in_ST0 <= *plVar3) goto LAB_0024b70b;
      uVar2 = uVar2 + 1;
      plVar3 = plVar3 + 1;
    } while (uVar2 != 0x7f);
    uVar2 = 0x7f;
LAB_0024b70b:
    __s[uVar2 & 0xffffffff] = __s[uVar2 & 0xffffffff] + 1;
    iVar5 = iVar5 + 1;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = lVar6;
    if (iVar5 == 10000) {
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x400);
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x80;
      lVar4 = 0;
      do {
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4] = 0.0078125;
        (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start + lVar4)[1] = 0.0078125;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 0x80);
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_e8 = chi_percentil(&local_108,&local_148);
      uStack_e0 = (undefined2)extraout_XMM0_Qb;
      uStack_de = (undefined6)((ulong)extraout_XMM0_Qb >> 0x10);
      local_58.m_start = "REQUIRE";
      local_58.m_size = 7;
      local_38.file =
           "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
      ;
      local_38.line = 0xc2;
      Catch::StringRef::StringRef(&local_48,"(0.01 < c2_p and c2_p < 0.99)");
      Catch::AssertionHandler::AssertionHandler(&local_a8,&local_58,&local_38,local_48,Normal);
      local_58.m_start =
           (char *)(CONCAT71(local_58.m_start._1_7_,-(local_e8 < 0.99) & -(0.01 < local_e8)) &
                   0xffffffffffffff01);
      Catch::AssertionHandler::handleExpr<bool>(&local_a8,(ExprLhs<bool> *)&local_58);
      Catch::AssertionHandler::complete(&local_a8);
      if (local_a8.m_completed == false) {
        (*(local_a8.m_resultCapture)->_vptr_IResultCapture[0xe])();
      }
      if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
          super__Vector_impl_data._M_start != (longdouble *)0x0) {
        operator_delete(local_128.super__Vector_base<long_double,_std::allocator<long_double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void continuous_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  const int bins{128};
  const result_type dp{result_type(1) / result_type(bins)};
  const int N{10000};
  std::vector<result_type> quantil;
  std::vector<int> count(bins, 0);
  for (int i{1}; i < bins; ++i)
    quantil.push_back(d.icdf(dp * i));
  trng::lcg64_shift R;
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R)};
    int bin{0};
    while (bin < bins - 1 and x > quantil[bin])
      ++bin;
    ++count[bin];
  }
  const std::vector<double> p(bins, 1.0 / bins);
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}